

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSLUtils.cpp
# Opt level: O1

String * __thiscall
Diligent::GetHLSLProfileString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,SHADER_TYPE ShaderType,
          ShaderVersion ShaderModel)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  uint uVar3;
  char cVar4;
  char cVar5;
  char *pcVar6;
  SHADER_TYPE SVar7;
  uint in_register_00000014;
  int iVar8;
  string msg;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar8 = (int)this;
  if (iVar8 < 0x100) {
    if (iVar8 < 0x10) {
      switch(iVar8) {
      case 1:
        pcVar6 = "vs";
        break;
      case 2:
        pcVar6 = "ps";
        break;
      default:
        goto switchD_002affdc_caseD_3;
      case 4:
        pcVar6 = "gs";
        break;
      case 8:
        pcVar6 = "hs";
      }
    }
    else if (iVar8 < 0x40) {
      if (iVar8 == 0x10) {
        pcVar6 = "ds";
      }
      else {
        if (iVar8 != 0x20) goto switchD_002affdc_caseD_3;
        pcVar6 = "cs";
      }
    }
    else if (iVar8 == 0x40) {
      pcVar6 = "as";
    }
    else {
      if (iVar8 != 0x80) goto switchD_002affdc_caseD_3;
      pcVar6 = "ms";
    }
  }
  else {
    if (iVar8 < 0x800) {
      if (((iVar8 != 0x100) && (iVar8 != 0x200)) && (iVar8 != 0x400)) {
switchD_002affdc_caseD_3:
        FormatString<char[20]>(&local_48,(char (*) [20])"Unknown shader type");
        DebugAssertionFailed
                  (local_48._M_dataplus._M_p,"GetHLSLProfileString",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/HLSLUtils.cpp"
                   ,0x5b);
LAB_002b02d6:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002b00c1;
      }
    }
    else if (iVar8 < 0x2000) {
      if ((iVar8 != 0x800) && (iVar8 != 0x1000)) goto switchD_002affdc_caseD_3;
    }
    else if (iVar8 != 0x2000) {
      if (iVar8 != 0x4000) goto switchD_002affdc_caseD_3;
      FormatString<char[24]>(&local_48,(char (*) [24])"Unsupported shader type");
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"GetHLSLProfileString",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/HLSLUtils.cpp"
                 ,0x58);
      goto LAB_002b02d6;
    }
    pcVar6 = "lib";
  }
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar6);
LAB_002b00c1:
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cVar5 = '\x01';
  if ((SHADER_TYPE_HULL|SHADER_TYPE_VERTEX) < ShaderType) {
    SVar7 = ShaderType;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (SVar7 < (SHADER_TYPE_AMPLIFICATION|SHADER_TYPE_COMPUTE|SHADER_TYPE_GEOMETRY)) {
        cVar5 = cVar5 + -2;
        goto LAB_002b0147;
      }
      if (SVar7 < (SHADER_TYPE_RAY_MISS|SHADER_TYPE_RAY_GEN|SHADER_TYPE_MESH|
                   SHADER_TYPE_AMPLIFICATION|SHADER_TYPE_COMPUTE|SHADER_TYPE_HULL)) {
        cVar5 = cVar5 + -1;
        goto LAB_002b0147;
      }
      if (SVar7 < (SHADER_TYPE_CALLABLE|SHADER_TYPE_RAY_CLOSEST_HIT|SHADER_TYPE_RAY_MISS|
                   SHADER_TYPE_RAY_GEN|SHADER_TYPE_DOMAIN)) goto LAB_002b0147;
      bVar2 = 99999 < SVar7;
      SVar7 = SVar7 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar2);
    cVar5 = cVar5 + '\x01';
  }
LAB_002b0147:
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_48,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_48._M_dataplus._M_p,(uint)local_48._M_string_length,ShaderType);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  cVar5 = '\x01';
  if (4 < in_register_00000014 >> 1) {
    uVar3 = in_register_00000014;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar3 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_002b01fd;
      }
      if (uVar3 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_002b01fd;
      }
      if (uVar3 < 10000) goto LAB_002b01fd;
      bVar2 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar2);
    cVar5 = cVar5 + '\x01';
  }
LAB_002b01fd:
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_48,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_48._M_dataplus._M_p,(uint)local_48._M_string_length,in_register_00000014);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

String GetHLSLProfileString(SHADER_TYPE ShaderType, ShaderVersion ShaderModel)
{
    String strShaderProfile;

    static_assert(SHADER_TYPE_LAST == 0x4000, "Please update the switch below to handle the new shader type");
    switch (ShaderType)
    {
        // clang-format off
        case SHADER_TYPE_VERTEX:           strShaderProfile = "vs"; break;
        case SHADER_TYPE_PIXEL:            strShaderProfile = "ps"; break;
        case SHADER_TYPE_GEOMETRY:         strShaderProfile = "gs"; break;
        case SHADER_TYPE_HULL:             strShaderProfile = "hs"; break;
        case SHADER_TYPE_DOMAIN:           strShaderProfile = "ds"; break;
        case SHADER_TYPE_COMPUTE:          strShaderProfile = "cs"; break;
        case SHADER_TYPE_AMPLIFICATION:    strShaderProfile = "as"; break;
        case SHADER_TYPE_MESH:             strShaderProfile = "ms"; break;
        case SHADER_TYPE_RAY_GEN:
        case SHADER_TYPE_RAY_MISS:
        case SHADER_TYPE_RAY_CLOSEST_HIT:
        case SHADER_TYPE_RAY_ANY_HIT:
        case SHADER_TYPE_RAY_INTERSECTION:
        case SHADER_TYPE_CALLABLE:         strShaderProfile = "lib"; break;
        case SHADER_TYPE_TILE:
            UNSUPPORTED("Unsupported shader type");
            break;
        // clang-format on
        default: UNEXPECTED("Unknown shader type");
    }

    strShaderProfile += "_";
    strShaderProfile += std::to_string(ShaderModel.Major);
    strShaderProfile += "_";
    strShaderProfile += std::to_string(ShaderModel.Minor);

    return strShaderProfile;
}